

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_lookup_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_LookupTest_::
Count<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(Count<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __normal_iterator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_*,_std::vector<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>_>
  _Var3;
  long lVar4;
  char *pcVar5;
  __normal_iterator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_*,_std::vector<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>_>
  _Var6;
  SharedLock m_1;
  vector<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  values;
  TypeParam m;
  DoNothing local_519;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_518;
  internal local_510 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_508;
  AssertHelper local_500;
  __normal_iterator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_*,_std::vector<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>_>
  local_4f8;
  __normal_iterator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_*,_std::vector<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>_>
  _Stack_4f0;
  long local_4e8;
  undefined1 local_4e0 [24];
  long alStack_4c8 [3];
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_4b0;
  
  local_4f8._M_current = (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)0x0;
  _Stack_4f0._M_current = (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)0x0;
  local_4e8 = 0;
  std::
  generate_n<std::back_insert_iterator<std::vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>>,int,phmap::priv::hash_internal::Generator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,void>>
            ();
  _Var3._M_current = _Stack_4f0._M_current;
  lVar4 = 0x40;
  do {
    *(undefined8 *)(local_4e0 + lVar4) = 0;
    *(undefined8 *)(local_4e0 + lVar4 + 8) = 0;
    *(undefined8 *)((long)&_Stack_4f0._M_current + lVar4) = 0;
    *(undefined8 *)((long)&local_4e8 + lVar4) = 0;
    *(undefined8 *)((long)alStack_4c8 + lVar4) = 0;
    *(long *)((long)alStack_4c8 + lVar4 + 8) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
    next_id<phmap::priv::StatefulTestingEqual>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
         next_id<phmap::priv::StatefulTestingEqual>()::gId + 1;
    *(long *)((long)alStack_4c8 + lVar4 + 0x10) =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId;
    hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
    next_id<phmap::priv::StatefulTestingHash>()::gId =
         hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
         next_id<phmap::priv::StatefulTestingHash>()::gId + 1;
    *(undefined8 *)((long)&local_4b0.sets_._M_elems[0].set_.ctrl_ + lVar4) = 0;
    lVar4 = lVar4 + 0x48;
  } while (lVar4 != 0x4c0);
  if (local_4f8._M_current != _Stack_4f0._M_current) {
    _Var6._M_current = local_4f8._M_current;
    do {
      local_500.data_._0_4_ = 0;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (_Var6._M_current)->first;
      parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
      ::
      find<phmap::priv::hash_internal::EnumClass,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
                ((iterator *)local_4e0,
                 (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
                  *)&local_4b0,&(_Var6._M_current)->first,
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,0),&local_519);
      local_518._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((Inner *)local_4e0._0_8_ != (Inner *)0x0);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_510,"0","m.count(p.first)",(int *)&local_500,(unsigned_long *)&local_518);
      if (local_510[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_518);
        testing::PrintToString<phmap::priv::hash_internal::EnumClass>
                  ((string *)local_4e0,&(_Var6._M_current)->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_518._M_head_impl + 0x10),(char *)local_4e0._0_8_,
                   local_4e0._8_8_);
        pcVar5 = "";
        if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_508->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_500,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x4a,pcVar5);
        testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
        testing::internal::AssertHelper::~AssertHelper(&local_500);
        if ((Inner *)local_4e0._0_8_ != (Inner *)(local_4e0 + 0x10)) {
          operator_delete((void *)local_4e0._0_8_,(ulong)(local_4e0._16_8_ + 1));
        }
        if (local_518._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_518._M_head_impl + 8))();
        }
      }
      if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_508,local_508);
      }
      _Var6._M_current = _Var6._M_current + 1;
    } while (_Var6._M_current != _Var3._M_current);
  }
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>*,std::vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>>>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_4b0,local_4f8,_Stack_4f0);
  _Var3._M_current = _Stack_4f0._M_current;
  if (local_4f8._M_current != _Stack_4f0._M_current) {
    _Var6._M_current = local_4f8._M_current;
    do {
      local_500.data_._0_4_ = 1;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (_Var6._M_current)->first;
      parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
      ::
      find<phmap::priv::hash_internal::EnumClass,phmap::LockableBaseImpl<phmap::NullMutex>::DoNothing>
                ((iterator *)local_4e0,
                 (parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
                  *)&local_4b0,&(_Var6._M_current)->first,
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0),&local_519);
      local_518._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (ulong)((Inner *)local_4e0._0_8_ != (Inner *)0x0);
      testing::internal::CmpHelperEQ<int,unsigned_long>
                (local_510,"1","m.count(p.first)",(int *)&local_500,(unsigned_long *)&local_518);
      if (local_510[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_518);
        testing::PrintToString<phmap::priv::hash_internal::EnumClass>
                  ((string *)local_4e0,&(_Var6._M_current)->first);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_518._M_head_impl + 0x10),(char *)local_4e0._0_8_,
                   local_4e0._8_8_);
        pcVar5 = "";
        if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_508->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_500,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_lookup_test.h"
                   ,0x4d,pcVar5);
        testing::internal::AssertHelper::operator=(&local_500,(Message *)&local_518);
        testing::internal::AssertHelper::~AssertHelper(&local_500);
        if ((Inner *)local_4e0._0_8_ != (Inner *)(local_4e0 + 0x10)) {
          operator_delete((void *)local_4e0._0_8_,(ulong)(local_4e0._16_8_ + 1));
        }
        if (local_518._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_518._M_head_impl + 8))();
        }
      }
      if (local_508 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_508,local_508);
      }
      _Var6._M_current = _Var6._M_current + 1;
    } while (_Var6._M_current != _Var3._M_current);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_4b0);
  if (local_4f8._M_current != (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)0x0) {
    operator_delete(local_4f8._M_current,local_4e8 - (long)local_4f8._M_current);
  }
  return;
}

Assistant:

TYPED_TEST_P(LookupTest, EqualRange) {
  using std::get;
  using T = hash_internal::GeneratedType<TypeParam>;
  std::vector<T> values;
  std::generate_n(std::back_inserter(values), 10,
                  hash_internal::Generator<T>());
  TypeParam m;
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(0, std::distance(r.first, r.second));
  }
  m.insert(values.begin(), values.end());
  for (const auto& p : values) {
    auto r = m.equal_range(p.first);
    ASSERT_EQ(1, std::distance(r.first, r.second));
    EXPECT_EQ(p.second, get<1>(*r.first)) << ::testing::PrintToString(p.first);
  }
}